

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_TestShell::createTest
          (TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_TestShell *this)

{
  TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_TestShell *this_local;
  
  this_00 = (TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Test::
  TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, TerminalOrHonorInEachSet)
{
	addPair(Tile::WhiteDragon);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::SevenOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(2, r.doubling_factor);
}